

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O1

void * Memory::InPlaceFreeListPolicy::New
                 (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *allocator)

{
  bool bVar1;
  _func_void *p_Var2;
  _func_void *p_Var3;
  char *__s;
  void *pvVar4;
  size_t __n;
  _func_void *tempRecoverMemoryFunc;
  _func_void *tempOutOfMemoryFunc;
  
  bVar1 = allocator->needsDelayFreeList;
  p_Var2 = (allocator->super_Allocator).outOfMemoryFunc;
  p_Var3 = (allocator->super_Allocator).recoverMemoryFunc;
  (allocator->super_Allocator).outOfMemoryFunc = (_func_void *)0x0;
  (allocator->super_Allocator).recoverMemoryFunc = (_func_void *)0x0;
  if (bVar1 == true) {
    __s = ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                    (allocator,0x400);
    (allocator->super_Allocator).outOfMemoryFunc = p_Var2;
    (allocator->super_Allocator).recoverMemoryFunc = p_Var3;
    if (__s == (char *)0x0) {
      return (void *)0x0;
    }
    __n = 0x400;
  }
  else {
    __s = ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                    (allocator,0x200);
    (allocator->super_Allocator).outOfMemoryFunc = p_Var2;
    (allocator->super_Allocator).recoverMemoryFunc = p_Var3;
    if (__s == (char *)0x0) {
      return (void *)0x0;
    }
    __n = 0x200;
  }
  pvVar4 = memset(__s,0,__n);
  return pvVar4;
}

Assistant:

void * InPlaceFreeListPolicy::New(ArenaAllocatorBase<InPlaceFreeListPolicy> * allocator)
{
#if DBG
    // Allocate freeList followed by delayFreeList
    // A delayFreeList will enable us to detect use-after free scenarios in debug builds
    if (allocator->HasDelayFreeList())
    {
        return AllocatorNewNoThrowNoRecoveryArrayZ(ArenaAllocator, allocator, FreeObject *, 2 * buckets);
    }
#endif
    return AllocatorNewNoThrowNoRecoveryArrayZ(ArenaAllocator, allocator, FreeObject *, buckets);
}